

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

void add(uint *a,uint b,int *retenue,unsigned_long base)

{
  uint uVar1;
  
  uVar1 = *a;
  if (base - uVar1 <= (ulong)b) {
    *retenue = 1;
    uVar1 = *a - (int)base;
  }
  *a = uVar1 + b;
  return;
}

Assistant:

void add(unsigned int *a, const unsigned int b, int *retenue, const long unsigned int base) {
    /**
     * Addition avec overflow p/r a la base
     */
    if(base - *a > b) {
        *a += b;
    }
    else{
        *retenue = 1;
        *a -= base;
        *a += b;
    }
}